

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunArrayToElements(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmInstruction *pVVar1;
  VmValue *dst;
  TypeBase *type;
  uint uVar2;
  VmFunction *pVVar3;
  VmBlock *this;
  VmValue **ppVVar4;
  VmConstant *pVVar5;
  VmInstruction *pVVar6;
  TypeArray *type_00;
  VmConstant *src;
  VmInstruction *pVVar7;
  VmInstruction *elementInst;
  VmValue *element;
  uint i;
  VmConstant *tempAddress;
  TypeBase *elementType;
  TypeArray *typeArray;
  VmInstruction *storeValue;
  VmConstant *storeOffset;
  VmValue *storeAddress;
  VmInstruction *next;
  VmInstruction *curr_1;
  VmBlock *block;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar3 = getType<VmFunction>(value);
  if (pVVar3 == (VmFunction *)0x0) {
    this = getType<VmBlock>(value);
    if (this != (VmBlock *)0x0) {
      module->currentBlock = this;
      pVVar1 = this->firstInstruction;
      while (next = pVVar1, next != (VmInstruction *)0x0) {
        pVVar1 = next->nextSibling;
        if (next->cmd == VM_INST_STORE_STRUCT) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&next->arguments,0);
          dst = *ppVVar4;
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&next->arguments,1);
          pVVar5 = getType<VmConstant>(*ppVVar4);
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&next->arguments,2);
          pVVar6 = getType<VmInstruction>(*ppVVar4);
          if (((pVVar6 != (VmInstruction *)0x0) && (pVVar6->cmd == VM_INST_ARRAY)) &&
             (uVar2 = SmallArray<VmValue_*,_8U>::size(&(pVVar6->super_VmValue).users), uVar2 == 1))
          {
            this->insertPoint = next;
            type_00 = getType<TypeArray>((pVVar6->super_VmValue).type.structType);
            type = type_00->subType;
            src = anon_unknown.dwarf_aa461::CreateAlloca
                            (ctx,module,(next->super_VmValue).source,&type_00->super_TypeBase,
                             "array_elem",true);
            for (element._4_4_ = 0; uVar2 = SmallArray<VmValue_*,_4U>::size(&pVVar6->arguments),
                element._4_4_ < uVar2; element._4_4_ = element._4_4_ + 1) {
              ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,element._4_4_);
              elementInst = (VmInstruction *)*ppVVar4;
              pVVar7 = getType<VmInstruction>((VmValue *)elementInst);
              if (pVVar7 == (VmInstruction *)0x0) {
                anon_unknown.dwarf_aa461::CreateStore
                          (ctx,module,(next->super_VmValue).source,type,&src->super_VmValue,
                           (VmValue *)elementInst,(int)type->size * element._4_4_);
              }
              else {
                if (pVVar7->cmd == VM_INST_DOUBLE_TO_FLOAT) {
                  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
                  elementInst = (VmInstruction *)*ppVVar4;
                }
                this->insertPoint = pVVar7;
                anon_unknown.dwarf_aa461::CreateStore
                          (ctx,module,(next->super_VmValue).source,type,&src->super_VmValue,
                           &elementInst->super_VmValue,(int)type->size * element._4_4_);
                this->insertPoint = next;
              }
            }
            anon_unknown.dwarf_aa461::CreateMemCopy
                      (module,(next->super_VmValue).source,dst,pVVar5->iValue,&src->super_VmValue,0,
                       (int)(type_00->super_TypeBase).size);
            this->insertPoint = this->lastInstruction;
            VmBlock::RemoveInstruction(this,next);
          }
        }
      }
      module->currentBlock = (VmBlock *)0x0;
    }
  }
  else {
    module->currentFunction = pVVar3;
    for (block = pVVar3->firstBlock; block != (VmBlock *)0x0; block = block->nextSibling) {
      RunArrayToElements(ctx,module,&block->super_VmValue);
    }
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunArrayToElements(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunArrayToElements(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			// If replacement succeeds, we will continue from the same place to handle multi-level arrays
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd == VM_INST_STORE_STRUCT)
			{
				VmValue *storeAddress = curr->arguments[0];
				VmConstant *storeOffset = getType<VmConstant>(curr->arguments[1]);
				VmInstruction *storeValue = getType<VmInstruction>(curr->arguments[2]);

				if(storeValue)
				{
					if(storeValue->cmd == VM_INST_ARRAY && storeValue->users.size() == 1)
					{
						block->insertPoint = curr;

						TypeArray *typeArray = getType<TypeArray>(storeValue->type.structType);

						TypeBase *elementType = typeArray->subType;

						VmConstant *tempAddress = CreateAlloca(ctx, module, curr->source, typeArray, "array_elem", true);

						for(unsigned i = 0; i < storeValue->arguments.size(); i++)
						{
							VmValue *element = storeValue->arguments[i];

							if(VmInstruction *elementInst = getType<VmInstruction>(element))
							{
								if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
									element = elementInst->arguments[0];

								block->insertPoint = elementInst;

								CreateStore(ctx, module, curr->source, elementType, tempAddress, element, unsigned(elementType->size * i));

								block->insertPoint = curr;
							}
							else
							{
								CreateStore(ctx, module, curr->source, elementType, tempAddress, element, unsigned(elementType->size * i));
							}
						}

						CreateMemCopy(module, curr->source, storeAddress, storeOffset->iValue, tempAddress, 0, int(typeArray->size));

						block->insertPoint = block->lastInstruction;

						block->RemoveInstruction(curr);
					}
				}
			}

			curr = next;
		}

		module->currentBlock = NULL;
	}
}